

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O0

void ts_tree_cursor_init(TreeCursor *self,TSNode node)

{
  uint uVar1;
  TSNode self_00;
  TSNode self_01;
  undefined1 auVar2 [24];
  uint32_t uVar3;
  TSPoint TVar4;
  TreeCursorEntry *pTVar5;
  TSTree *in_stack_ffffffffffffffb8;
  uint32_t uStack_24;
  uint uStack_14;
  TreeCursor *self_local;
  
  self->tree = node.tree;
  (self->stack).size = 0;
  array__grow((VoidArray *)&self->stack,0x20);
  uVar1 = (self->stack).size;
  (self->stack).size = uVar1 + 1;
  pTVar5 = (self->stack).contents + uVar1;
  auVar2 = node._8_24_;
  self_00.tree = in_stack_ffffffffffffffb8;
  self_00.context[0] = auVar2._0_4_;
  self_00.context[1] = auVar2._4_4_;
  self_00.context[2] = auVar2._8_4_;
  self_00.context[3] = auVar2._12_4_;
  self_00.id = (void *)auVar2._16_8_;
  uVar3 = ts_node_start_byte(self_00);
  self_01.tree = in_stack_ffffffffffffffb8;
  self_01.context[0] = auVar2._0_4_;
  self_01.context[1] = auVar2._4_4_;
  self_01.context[2] = auVar2._8_4_;
  self_01.context[3] = auVar2._12_4_;
  self_01.id = (void *)auVar2._16_8_;
  TVar4 = ts_node_start_point(self_01);
  uStack_24 = TVar4.row;
  pTVar5->subtree = (Subtree *)node.id;
  (pTVar5->position).bytes = uVar3;
  (pTVar5->position).extent.row = uStack_24;
  *(ulong *)&(pTVar5->position).extent.column = (ulong)TVar4 >> 0x20;
  *(ulong *)&pTVar5->structural_child_index = (ulong)uStack_14 << 0x20;
  return;
}

Assistant:

void ts_tree_cursor_init(TreeCursor *self, TSNode node) {
  self->tree = node.tree;
  array_clear(&self->stack);
  array_push(&self->stack, ((TreeCursorEntry) {
    .subtree = (const Subtree *)node.id,
    .position = {
      ts_node_start_byte(node),
      ts_node_start_point(node)
    },
    .child_index = 0,
    .structural_child_index = 0,
  }));
}